

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O0

void __thiscall vec<vec<Propagator_*>_>::reserve(vec<vec<Propagator_*>_> *this,uint size)

{
  void *pvVar1;
  uint in_ESI;
  long in_RDI;
  undefined4 local_1c;
  
  if (*(uint *)(in_RDI + 4) < in_ESI) {
    if (*(int *)(in_RDI + 4) == 0) {
      local_1c = in_ESI;
      if (in_ESI < 3) {
        local_1c = 2;
      }
      *(uint *)(in_RDI + 4) = local_1c;
    }
    else {
      do {
        *(uint *)(in_RDI + 4) = *(int *)(in_RDI + 4) * 3 + 1U >> 1;
      } while (*(uint *)(in_RDI + 4) < in_ESI);
    }
    pvVar1 = realloc(*(void **)(in_RDI + 8),(ulong)*(uint *)(in_RDI + 4) << 4);
    *(void **)(in_RDI + 8) = pvVar1;
  }
  return;
}

Assistant:

void reserve(unsigned int size) {
		if (size > cap) {
			if (cap == 0) {
				cap = (size > 2) ? size : 2;
			} else {
				do {
					cap = (cap * 3 + 1) >> 1;
				} while (cap < size);
			}
			data = (T*)realloc((char*)data, cap * sizeof(T));
		}
	}